

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commandline.cpp
# Opt level: O0

void __thiscall CommandLine::~CommandLine(CommandLine *this)

{
  bool bVar1;
  reference ppCVar2;
  CommandLineOption *opt;
  Iterator __end1;
  Iterator __begin1;
  List<CommandLineOption_*> *__range1;
  CommandLine *this_local;
  
  List<CommandLineOption_*>::begin((Iterator *)&__end1._M_node,&this->_options);
  List<CommandLineOption_*>::end((Iterator *)&opt,&this->_options);
  while( true ) {
    bVar1 = std::operator!=((_Self *)&__end1._M_node,(_Self *)&opt);
    if (!bVar1) break;
    ppCVar2 = std::_Deque_iterator<CommandLineOption_*,_CommandLineOption_*&,_CommandLineOption_**>
              ::operator*((_Deque_iterator<CommandLineOption_*,_CommandLineOption_*&,_CommandLineOption_**>
                           *)&__end1._M_node);
    if (*ppCVar2 != (CommandLineOption *)0x0) {
      (*(*ppCVar2)->_vptr_CommandLineOption[1])();
    }
    std::_Deque_iterator<CommandLineOption_*,_CommandLineOption_*&,_CommandLineOption_**>::
    operator++((_Deque_iterator<CommandLineOption_*,_CommandLineOption_*&,_CommandLineOption_**> *)
               &__end1._M_node);
  }
  List<CommandLineOption_*>::~List(&this->_options);
  return;
}

Assistant:

CommandLine::~CommandLine()
{
	for (CommandLineOption* opt : _options)
		delete opt;
}